

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpIntNegate::TypeOpIntNegate(TypeOpIntNegate *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"~",&local_31);
  TypeOpUnary::TypeOpUnary(&this->super_TypeOpUnary,t,CPUI_INT_NEGATE,&local_30,TYPE_UINT,TYPE_UINT)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOpUnary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f2f30;
  (this->super_TypeOpUnary).super_TypeOp.opflags = 0x8000;
  (this->super_TypeOpUnary).super_TypeOp.addlflags = 1;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_NEGATE;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe618;
  (this->super_TypeOpUnary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntNegate::TypeOpIntNegate(TypeFactory *t)
  : TypeOpUnary(t,CPUI_INT_NEGATE,"~",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::unary;
  addlflags = inherits_sign;
  behave = new OpBehaviorIntNegate();
}